

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value)

{
  bool bVar1;
  ScriptType SVar2;
  pointer ppVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  ByteData local_98;
  ScriptOperator local_80;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_38;
  const_iterator ite;
  ScriptType SStack_28;
  bool is_find;
  ScriptType key;
  int32_t op_code;
  int64_t value_local;
  ScriptElement *this_local;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_00b63618;
  this->type_ = kElementNumber;
  ScriptOperator::ScriptOperator(&this->op_code_,kOpInvalidOpCode);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = value;
  if ((-2 < value) && (value < 0x11)) {
    SStack_28 = kOpFalse;
    if (value == -1) {
      SStack_28 = kOp1Negate;
    }
    else if (0 < value) {
      SStack_28 = (int)value + kOpReserved;
    }
    ite._M_node._4_4_ = SStack_28;
    ite._M_node._3_1_ = 0;
    bVar1 = ::std::
            map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
            ::empty((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                     *)g_operator_map);
    if (!bVar1) {
      local_40._M_node =
           (_Base_ptr)
           ::std::
           map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
           ::find((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                   *)g_operator_map,(key_type *)((long)&ite._M_node + 4));
      ::std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>::
      _Rb_tree_const_iterator(&local_38,&local_40);
      local_50._M_node =
           (_Base_ptr)
           ::std::
           map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
           ::end((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                  *)g_operator_map);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>::
      _Rb_tree_const_iterator(&local_48,&local_50);
      bVar1 = ::std::operator!=(&local_38,&local_48);
      if (bVar1) {
        ppVar3 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
                 ::operator->(&local_38);
        ScriptOperator::operator=(&this->op_code_,&ppVar3->second);
        ite._M_node._3_1_ = 1;
      }
    }
    if ((ite._M_node._3_1_ & 1) == 0) {
      ScriptOperator::ScriptOperator(&local_80,ite._M_node._4_4_);
      ScriptOperator::operator=(&this->op_code_,&local_80);
      ScriptOperator::~ScriptOperator((ScriptOperator *)0x419384);
    }
    SVar2 = ScriptOperator::GetDataType(&this->op_code_);
    if (SVar2 != kOpInvalidOpCode) {
      this->type_ = kElementOpCode;
    }
  }
  if (this->type_ == kElementNumber) {
    SerializeScriptNum(&local_b0,this->value_);
    ByteData::ByteData(&local_98,&local_b0);
    ByteData::operator=(&this->binary_data_,&local_98);
    ByteData::~ByteData((ByteData *)0x419439);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value)
    : type_(kElementNumber),
      op_code_(kOpInvalidOpCode),
      binary_data_(),
      value_(value) {
  if ((value >= -1) && (value <= 16)) {
    int32_t op_code = static_cast<int32_t>(kOp_0);
    if (value == -1) {
      op_code = static_cast<int32_t>(kOp1Negate);

    } else if (value >= 1) {
      op_code = static_cast<int32_t>(kOp_1);
      op_code += static_cast<int32_t>(value) - 1;
    }

    ScriptType key = static_cast<ScriptType>(op_code);
    bool is_find = false;
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite = g_operator_map.find(key);
      if (ite != g_operator_map.end()) {
        op_code_ = ite->second;
        is_find = true;
      }
    }
    if (!is_find) {
      op_code_ = ScriptOperator(key);
    }
    if (op_code_.GetDataType() != kOpInvalidOpCode) {
      type_ = kElementOpCode;
    }
  }

  if (type_ == kElementNumber) {
    // set binary data
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}